

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void executeTransaction(string *transbuffer,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *lockitem)

{
  uint index;
  bool bVar1;
  int iVar2;
  long lVar3;
  SQLParserResult *pSVar4;
  size_t sVar5;
  InsertStatement *stmt;
  table *ptVar6;
  UpdateStatement *pUVar7;
  ostream *poVar8;
  fd_set *pfVar9;
  SelectStatement *stmt_00;
  SQLStatement *pSVar10;
  char *pcVar11;
  uint uVar12;
  fd_set *__writefds;
  uint uVar13;
  fd_set *in_R8;
  timeval *in_R9;
  uint i;
  ulong uVar14;
  pointer pbVar15;
  int selectvalue;
  pointer local_398;
  pointer local_390;
  uint local_384;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query;
  string select_item;
  string stable;
  string temp_update_query;
  string t_query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  update_query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  querys;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string where;
  undefined1 local_1f0 [24];
  string select_query;
  string operation;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  string local_100;
  string local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  local_60;
  
  iVar2 = 1000;
  uVar12 = 0;
  local_380 = lockitem;
  while( true ) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_118,local_380);
    bVar1 = check_true_size(&local_118);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118);
    if (bVar1) break;
    uVar13 = uVar12 + 1;
    query._M_dataplus._M_p = (pointer)(long)iVar2;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&query);
    iVar2 = iVar2 * 2;
    bVar1 = 2 < uVar12;
    uVar12 = uVar13;
    if (bVar1) {
      iVar2 = 1000;
    }
  }
  split(&querys,transbuffer,';');
  update_query.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  update_query.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  update_query.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_390 = querys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  uVar12 = 1;
  local_398 = querys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (local_398 == local_390) {
LAB_0010f25d:
      local_398 = (pointer)0x0;
      if ((uVar12 & 1) != 0) {
        local_398 = (pointer)0x0;
        local_390 = (pointer)((ulong)local_390 & 0xffffffff00000000);
        for (pbVar15 = querys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar15 !=
            querys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
          std::__cxx11::string::string((string *)&query,(string *)pbVar15);
          std::__cxx11::string::string((string *)&local_100,(string *)&query);
          removespace(&t_query,&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          if (((t_query._M_string_length != 0) &&
              (lVar3 = std::__cxx11::string::find((char *)&query,0x11d4cf), lVar3 == -1)) &&
             (lVar3 = std::__cxx11::string::find((char *)&query,0x11d637), lVar3 == -1)) {
            std::__cxx11::string::append((char *)&query);
            pSVar4 = hsql::SQLParser::parseSQLString(&query);
            bVar1 = hsql::SQLParserResult::isValid(pSVar4);
            if (bVar1) {
              uVar14 = 0;
              while( true ) {
                sVar5 = hsql::SQLParserResult::size(pSVar4);
                if (sVar5 <= uVar14) break;
                pSVar10 = hsql::SQLParserResult::getMutableStatement(pSVar4,(int)uVar14);
                executeStatement(pSVar10,&table_list_abi_cxx11_);
                saveToFile(&table_list_abi_cxx11_);
                uVar14 = (ulong)((int)uVar14 + 1);
              }
            }
            else {
              lVar3 = std::__cxx11::string::find((char *)&query,0x11ddfd);
              if (lVar3 != -1) {
                std::__cxx11::string::_M_assign((string *)&query);
                local_398 = (pointer)(ulong)((int)local_398 + 1);
                local_390 = (pointer)CONCAT44(local_390._4_4_,(int)local_390 + 1);
              }
              pSVar4 = hsql::SQLParser::parseSQLString(&query);
              bVar1 = hsql::SQLParserResult::isValid(pSVar4);
              if (bVar1) {
                uVar14 = 0;
                while( true ) {
                  sVar5 = hsql::SQLParserResult::size(pSVar4);
                  if (sVar5 <= uVar14) break;
                  pSVar10 = hsql::SQLParserResult::getMutableStatement(pSVar4,(int)uVar14);
                  executeStatement(pSVar10,&table_list_abi_cxx11_);
                  saveToFile(&table_list_abi_cxx11_);
                  uVar14 = (ulong)((int)uVar14 + 1);
                }
              }
              else {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "Given string is not a valid SQL query.");
                poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
                pcVar11 = hsql::SQLParserResult::errorMsg(pSVar4);
                poVar8 = std::operator<<(poVar8,pcVar11);
                poVar8 = std::operator<<(poVar8,"(");
                iVar2 = hsql::SQLParserResult::errorLine(pSVar4);
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
                poVar8 = std::operator<<(poVar8,":");
                iVar2 = hsql::SQLParserResult::errorColumn(pSVar4);
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
                poVar8 = std::operator<<(poVar8,")");
                std::endl<char,std::char_traits<char>>(poVar8);
              }
            }
          }
          std::__cxx11::string::~string((string *)&t_query);
          std::__cxx11::string::~string((string *)&query);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_228,local_380);
      unlock_items(&local_228,(int)local_398);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_228);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&update_query);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&querys);
      return;
    }
    std::__cxx11::string::string((string *)&query,(string *)local_398);
    std::__cxx11::string::string((string *)&local_e0,(string *)&query);
    removespace(&t_query,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    if (t_query._M_string_length != 0) {
      lVar3 = std::__cxx11::string::find((char *)&query,0x11d4cf);
      if ((lVar3 == -1) &&
         (lVar3 = std::__cxx11::string::find((char *)&query,0x11d637), lVar3 == -1)) {
        std::__cxx11::string::append((char *)&query);
        pSVar4 = hsql::SQLParser::parseSQLString(&query);
        bVar1 = hsql::SQLParserResult::isValid(pSVar4);
        if (bVar1) {
          uVar14 = 0;
          while( true ) {
            sVar5 = hsql::SQLParserResult::size(pSVar4);
            iVar2 = (int)uVar14;
            if (sVar5 <= uVar14) break;
            lVar3 = std::__cxx11::string::find((char *)&query,0x11add2);
            if (lVar3 != -1) {
              stmt = (InsertStatement *)hsql::SQLParserResult::getMutableStatement(pSVar4,iVar2);
              std::__cxx11::string::string
                        ((string *)&select_item,stmt->tableName,(allocator *)&stable);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
              ::_Rb_tree(&local_60,&table_list_abi_cxx11_._M_t);
              ptVar6 = util::getTable(&select_item,
                                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                                       *)&local_60);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
              ::~_Rb_tree(&local_60);
              std::__cxx11::string::~string((string *)&select_item);
              if (ptVar6 == (table *)0x0) {
                uVar12 = 0;
              }
              else {
                bVar1 = table::insertcheck(ptVar6,stmt);
                uVar12 = uVar12 & 0xff;
                if (!bVar1) {
                  uVar12 = 0;
                }
              }
            }
            lVar3 = std::__cxx11::string::find((char *)&query,0x11ddfd);
            if (lVar3 != -1) {
              pUVar7 = (UpdateStatement *)hsql::SQLParserResult::getMutableStatement(pSVar4,iVar2);
              std::__cxx11::string::string
                        ((string *)&select_item,pUVar7->table->name,(allocator *)&stable);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
              ::_Rb_tree(&local_90,&table_list_abi_cxx11_._M_t);
              ptVar6 = util::getTable(&select_item,
                                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                                       *)&local_90);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
              ::~_Rb_tree(&local_90);
              std::__cxx11::string::~string((string *)&select_item);
              if ((ptVar6 == (table *)0x0) || (bVar1 = table::updatecheck(ptVar6,pUVar7), !bVar1)) {
                poVar8 = std::operator<<((ostream *)&std::cout,"cannot update this statement");
                std::endl<char,std::char_traits<char>>(poVar8);
                uVar12 = 0;
              }
            }
            uVar14 = (ulong)(iVar2 + 1);
          }
LAB_0010f214:
          if ((uVar12 & 1) != 0) goto LAB_0010f21a;
        }
        else {
          lVar3 = std::__cxx11::string::find((char *)&query,0x11ddfd);
          if (lVar3 != -1) {
            lVar3 = std::__cxx11::string::find((char *)&query,0x11d65b);
            uVar12 = uVar12 & 0xff;
            if (lVar3 != -1) {
              uVar12 = 0;
            }
            std::__cxx11::string::find((char *)&query,0x11d667);
            std::__cxx11::string::find((char *)&query,0x11ab96);
            std::__cxx11::string::find((char *)&query,0x11d667);
            std::__cxx11::string::substr((ulong)&select_item,(ulong)&query);
            split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stable,&select_item,'=');
            local_384 = uVar12;
            std::__cxx11::string::_M_assign((string *)&select_item);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&stable);
            std::__cxx11::string::find((char *)&query,0x11ddfd);
            std::__cxx11::string::find((char *)&query,0x11d667);
            std::__cxx11::string::find((char *)&query,0x11ddfd);
            std::__cxx11::string::substr((ulong)&stable,(ulong)&query);
            std::__cxx11::string::find((char *)&query,0x11ab96);
            std::__cxx11::string::find((char *)&query,0x11d511);
            std::__cxx11::string::find((char *)&query,0x11ab96);
            std::__cxx11::string::substr((ulong)&where,(ulong)&query);
            std::__cxx11::string::string((string *)&operation,"",(allocator *)&select_query);
            std::__cxx11::string::find((char *)&query,0x11d66b);
            std::__cxx11::string::assign((char *)&operation);
            std::operator+(&local_2d8,"select ",&select_item);
            std::operator+(&local_288,&local_2d8," from ");
            std::operator+(&local_268,&local_288,&stable);
            std::operator+(&local_248,&local_268," where ");
            std::operator+(&temp_update_query,&local_248,&where);
            std::operator+(&select_query,&temp_update_query,";");
            std::__cxx11::string::~string((string *)&temp_update_query);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)&local_288);
            std::__cxx11::string::~string((string *)&local_2d8);
            selectvalue = -1;
            pSVar4 = hsql::SQLParser::parseSQLString(&select_query);
            bVar1 = hsql::SQLParserResult::isValid(pSVar4);
            __writefds = (fd_set *)0x0;
            uVar12 = local_384;
            uVar13 = 0;
            if (bVar1) {
              while( true ) {
                pfVar9 = (fd_set *)hsql::SQLParserResult::size(pSVar4);
                iVar2 = (int)__writefds;
                uVar13 = uVar12;
                if (pfVar9 <= __writefds) break;
                stmt_00 = (SelectStatement *)
                          hsql::SQLParserResult::getMutableStatement(pSVar4,iVar2);
                if (stmt_00->fromTable->type == kTableName) {
                  std::__cxx11::string::string
                            ((string *)&temp_update_query,stmt_00->fromTable->name,
                             (allocator *)&local_248);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                  ::_Rb_tree(&local_c0,&table_list_abi_cxx11_._M_t);
                  ptVar6 = util::getTable(&temp_update_query,
                                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                                           *)&local_c0);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                  ::~_Rb_tree(&local_c0);
                  std::__cxx11::string::~string((string *)&temp_update_query);
                  if (ptVar6 == (table *)0x0) {
                    poVar8 = std::operator<<((ostream *)&std::cout,"did not find table ");
                    poVar8 = std::operator<<(poVar8,stmt_00->fromTable->name);
                    poVar8 = std::operator<<(poVar8," from database");
                    std::endl<char,std::char_traits<char>>(poVar8);
                    uVar12 = 0;
                  }
                  else {
                    table::select_abi_cxx11_
                              ((table *)local_1f0,(int)ptVar6,(fd_set *)stmt_00,__writefds,in_R8,
                               in_R9);
                    util::PrintRecords(stmt_00,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                                                *)local_1f0,ptVar6,&selectvalue);
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                               *)local_1f0);
                    bVar1 = std::operator==(&operation,"-");
                    selectvalue = selectvalue + (-(uint)bVar1 | 1);
                    uVar12 = uVar12 & 0xff;
                    if (selectvalue < 0) {
                      uVar12 = 0;
                    }
                  }
                }
                __writefds = (fd_set *)(ulong)(iVar2 + 1);
              }
            }
            std::operator+(&local_178,"update ",&stable);
            std::operator+(&local_158,&local_178," set ");
            std::operator+(&local_138,&local_158,&select_item);
            std::operator+(&local_2d8,&local_138," = ");
            std::__cxx11::to_string(&local_198,selectvalue);
            std::operator+(&local_288,&local_2d8,&local_198);
            std::operator+(&local_268,&local_288," where ");
            std::operator+(&local_248,&local_268,&where);
            std::operator+(&temp_update_query,&local_248,";");
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)&local_288);
            std::__cxx11::string::~string((string *)&local_198);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_178);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&update_query,&temp_update_query);
            pSVar4 = hsql::SQLParser::parseSQLString(&temp_update_query);
            bVar1 = hsql::SQLParserResult::isValid(pSVar4);
            index = 0;
            uVar12 = index;
            if (bVar1) {
              for (; sVar5 = hsql::SQLParserResult::size(pSVar4), uVar12 = uVar13, index < sVar5;
                  index = index + 1) {
                pUVar7 = (UpdateStatement *)hsql::SQLParserResult::getMutableStatement(pSVar4,index)
                ;
                bVar1 = executeUpdate(pUVar7,&table_list_abi_cxx11_,true);
                uVar13 = uVar13 & 0xff;
                if (!bVar1) {
                  uVar13 = 0;
                }
              }
            }
            std::__cxx11::string::~string((string *)&temp_update_query);
            std::__cxx11::string::~string((string *)&select_query);
            std::__cxx11::string::~string((string *)&operation);
            std::__cxx11::string::~string((string *)&where);
            std::__cxx11::string::~string((string *)&stable);
            std::__cxx11::string::~string((string *)&select_item);
            goto LAB_0010f214;
          }
          uVar12 = 0;
        }
        std::__cxx11::string::~string((string *)&t_query);
        std::__cxx11::string::~string((string *)&query);
        goto LAB_0010f25d;
      }
    }
LAB_0010f21a:
    std::__cxx11::string::~string((string *)&t_query);
    std::__cxx11::string::~string((string *)&query);
    local_398 = local_398 + 1;
  } while( true );
}

Assistant:

void executeTransaction(string transbuffer, vector<string> lockitem){
//    //check queue if thread in or out
    //lock on the record
//    con.lock();
//    for(auto item: lockitem) {
//        int sleep_time = 1000;
//        while (true) {
//            //con.lock();
//            //cout << item << "condition is : " << locks[item]<<endl;
//            if (locks.find(item) != locks.end() && locks[item] == 0) {
//                locks[item] = 1;
//                //con.unlock();
//                break;
//            }
//            if (locks.find(item) == locks.end()) {
//                locks.insert(make_pair(item, 1));
//                //con.unlock();
//                break;
//            }
//
//        }
//
//        this_thread::sleep_for(chrono::milliseconds(sleep_time));
//        sleep_time *= 2;
//    }
//
//    con.unlock();

    int sleep_time = 1000;
    int sleep_count = 0;
    while(true){
        if(check_true_size(lockitem)){
            break;
        }
        sleep_count++;
        //int v2 = rand() % 1000 + 1;
        this_thread::sleep_for(chrono::milliseconds(sleep_time));
        if(sleep_count > 3){
            sleep_time = 1000;
        }
        else{
            sleep_time *= 2;
        }
    }



    //threads_id.push(this_thread::get_id());

//    string previous_item = "";
//
//    //lock
//    con.lock();
//    while(true){
//
//        int true_size = 0;
//        map<string, int> temp_locks;
//
//        for(auto item: lockitem) {
//
//            if(item == previous_item){
//                previous_item = item;
//                true_size++;
//                continue;
//            }
//            else if(locks.find(item) != locks.end() && locks[item] == 0)
//            {
//                temp_locks[item] = 1;
//                locks[item] = 1;
//                true_size++;
//                previous_item = item;
//                continue;
//            }
//
//            else if(locks.find(item) == locks.end()){
//
//                temp_locks[item] = 1;
//                locks.insert(make_pair(item, 1));
//                true_size++;
//                previous_item = item;
//                continue;
//            }
//            previous_item = item;
//        }
//        if(true_size == lockitem.size()){
//            con.unlock();
//            break;
//        }
//        else {
//            for (std::map<string, int>::iterator it = temp_locks.begin(); it != temp_locks.end(); ++it) {
//                if (it->second == 1) {
//                    locks[it->first] = 0;
//                }
//            }
//        }
//        //int v2 = rand() % 1000 + 1;
//        this_thread::sleep_for(chrono::milliseconds(1000));
//    }

    //unlock
    //con.unlock();

    //check if the transbuffer can be executed.
    vector<string> querys = split(transbuffer, ';');
    bool cancommit = true;
    vector<string> update_query;

    for(auto query : querys){

        string t_query = removespace(query);
        if(t_query.length() < 1)
            continue;
        if(query.find("end transaction") != string::npos || query.find("commit") != string::npos)
            continue;

        query += ";";
        hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(query);
        // check whether the parsing was successful
        if (result->isValid()) {
            for (unsigned i = 0; i < result->size(); ++i) {
                //run sql query


                //check insert
                if(query.find("insert") != string::npos){

                    hsql::InsertStatement *stmt = (hsql::InsertStatement*)result->getMutableStatement(i);
                    table* totable = util::getTable(stmt->tableName, table_list);
                    if(totable == NULL)
                        cancommit = false;
                    if(totable != NULL && !totable->insertcheck(stmt))
                        cancommit = false;

                }

                if(query.find("update") != string::npos){
                    hsql::UpdateStatement *stmt = (hsql::UpdateStatement*)result->getMutableStatement(i);
                    table* totable = util::getTable(stmt->table->name, table_list);
                    if(totable == NULL)
                    {
                        cout << "cannot update this statement"<< endl;
                        cancommit = false;
                    }
                    if(totable != NULL && !totable->updatecheck(stmt))
                    {
                        cout << "cannot update this statement"<< endl;
                        cancommit = false;
                    }

                }


            }
        } else {

            //split update to two querys and check again
            if(query.find("update") != string::npos ){
                if(query.find("insert into") != string::npos )
                    cancommit = false;;
                string select_item = query.substr(query.find("set") + 3, query.find("where") - query.find("set") - 3);
                select_item = split(select_item, '=')[0];
                string stable = query.substr(query.find("update") + 6, query.find("set") - query.find("update") -6);
                string where = query.substr(query.find("where") + 5, query.find(";") - query.find("where") - 5);
                string operation = "";
                if(query.find("-")!= string::npos)
                    operation="-";
                else
                    operation="+";


                string select_query = "select " + select_item + " from " + stable + " where " + where + ";";


                //select query
                int selectvalue = -1;
                hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(select_query);
                if (result->isValid()) {
                    for (unsigned i = 0; i < result->size(); ++i) {
                        //run sql query
                        hsql::SelectStatement *stmt = (hsql::SelectStatement*)result->getMutableStatement(i);
                        if(stmt->fromTable->type == hsql::kTableName){
                            table* totable = util::getTable(stmt->fromTable->name, table_list);
                            if(totable == NULL){
                                cout<< "did not find table " << stmt->fromTable->name << " from database"<<endl;
                                cancommit = false;
                            }

                            if(totable != nullptr) {
                                util::PrintRecords(stmt, totable->select(stmt), totable, selectvalue);
                                if(operation == "-")
                                    selectvalue -= 1;
                                else
                                    selectvalue += 1;
                                if(selectvalue < 0)
                                    cancommit = false;

                            }
                        }

                    }
                } else {
                    //cout << "Given string is not a valid SQL query." << endl
                     //    << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                    cancommit = false;
                }
                //update query
                string temp_update_query = "update " + stable + " set " + select_item + " = " + to_string(selectvalue) + " where " + where + ";";
                update_query.push_back(temp_update_query);
                result = hsql::SQLParser::parseSQLString(temp_update_query);
                if (result->isValid()) {
                    for (unsigned i = 0; i < result->size(); ++i) {
                        //run sql query
                        hsql::UpdateStatement *stmt = (hsql::UpdateStatement*)result->getMutableStatement(i);
                        if(!executeUpdate(stmt, table_list, true)){
                            cancommit = false;
                        }
                    }
                } else {
                    //cout << "Given string is not a valid SQL query." << endl
                     //    << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                    cancommit = false;
                }


            }
            else{
                //cout << "Given string is not a valid SQL query." << endl
                 //    << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                cancommit = false;
            }


        }

        //cout << "find query" << query << endl;
        if(cancommit == false)
            break;
    }


    //commit
    int numberOfRowsModified = 0;
    if(cancommit){
        //cout << "do commit" << endl;
        int countupdate = 0;
        for(auto query: querys){
            //cout << "query: " << query << endl;
            string t_query = removespace(query);
            if(t_query.length() < 1)
                continue;
            if(query.find("end transaction") != string::npos || query.find("commit") != string::npos)
                continue;

            query += ";";
            hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(query);

            // check whether the parsing was successful
            if (result->isValid()) {
                for (unsigned i = 0; i < result->size(); ++i) {
                    //run sql query
                    executeStatement(result->getMutableStatement(i), table_list);
                    saveToFile(table_list);

                }
            } else {
                if(query.find("update") != string::npos){
                    numberOfRowsModified++;
                    query = update_query[countupdate];
                    countupdate += 1;
                }
                hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(query);

                // check whether the parsing was successful
                if (result->isValid()) {
                    for (unsigned i = 0; i < result->size(); ++i) {
                        //run sql query
                        executeStatement(result->getMutableStatement(i), table_list);
                        saveToFile(table_list);
                    }
                }
                else{
                    cout << "Given string is not a valid SQL query." << endl
                         << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                }

            }

        }
    }

    //execute the transbuffr
    unlock_items(lockitem, numberOfRowsModified);



}